

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O2

cio_error cio_buffered_stream_close(cio_buffered_stream *buffered_stream)

{
  if (buffered_stream == (cio_buffered_stream *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  if (buffered_stream->callback_is_running != 0) {
    buffered_stream->shall_close = true;
    return CIO_SUCCESS;
  }
  (*buffered_stream->stream->close)(buffered_stream->stream);
  return CIO_SUCCESS;
}

Assistant:

enum cio_error cio_buffered_stream_close(struct cio_buffered_stream *buffered_stream)
{
	if (cio_unlikely(buffered_stream == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (buffered_stream->callback_is_running == 0) {
		buffered_stream->stream->close(buffered_stream->stream);
	} else {
		buffered_stream->shall_close = true;
	}

	return CIO_SUCCESS;
}